

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

vec<4,_unsigned_int,_(glm::qualifier)0> __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::getValue
          (ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this,size_t ind)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec<4,_unsigned_int,_(glm::qualifier)0> vVar5;
  CanonicalDataSource CVar6;
  pointer pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  element_type *buff;
  uvec4 uVar8;
  vec<4,_unsigned_int,_(glm::qualifier)0> vVar9;
  string sStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 auVar10 [12];
  
  if (this->deviceBufferType - Texture1d < 3) {
    ensureHostBufferPopulated(this);
  }
  CVar6 = currentCanonicalDataSource(this);
  if (CVar6 == RenderBuffer) {
    buff = (this->renderAttributeBuffer).
           super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (buff->dataSize <= (long)ind) {
      std::operator+(&local_98,"out of bounds access in ManagedBuffer ",&this->name);
      std::operator+(&local_d8,&local_98," getValue(");
      std::__cxx11::to_string(&sStack_f8,ind);
      std::operator+(&local_b8,&local_d8,&sStack_f8);
      std::operator+(&local_78,&local_b8,")");
      exception(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&sStack_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      buff = (this->renderAttributeBuffer).
             super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    }
    uVar8 = getAttributeBufferData<glm::vec<4,unsigned_int,(glm::qualifier)0>>(buff,ind);
    vVar9.field_0 = uVar8.field_0;
    auVar10._4_4_ = uVar8.field_1;
    vVar9.field_2 = uVar8.field_2;
    vVar9.field_3 = uVar8.field_3;
    return vVar9;
  }
  if (CVar6 == NeedsCompute) {
    std::function<void_()>::operator()(&this->computeFunc);
    pvVar7 = (this->data->
             super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (ind < (ulong)((long)(this->data->
                            super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 4))
    goto LAB_001f0dd3;
    std::operator+(&local_98,"out of bounds access in ManagedBuffer ",&this->name);
    std::operator+(&local_d8,&local_98," getValue(");
    std::__cxx11::to_string(&sStack_f8,ind);
    std::operator+(&local_b8,&local_d8,&sStack_f8);
    std::operator+(&local_58,&local_b8,")");
    exception(&local_58);
    this_00 = &local_58;
  }
  else {
    if (CVar6 != HostData) {
      return (vec<4,_unsigned_int,_(glm::qualifier)0>)ZEXT416(0);
    }
    pvVar7 = (this->data->
             super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (ind < (ulong)((long)(this->data->
                            super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 4))
    goto LAB_001f0dd3;
    std::operator+(&local_98,"out of bounds access in ManagedBuffer ",&this->name);
    std::operator+(&local_d8,&local_98," getValue(");
    std::__cxx11::to_string(&sStack_f8,ind);
    std::operator+(&local_b8,&local_d8,&sStack_f8);
    std::operator+(&local_38,&local_b8,")");
    exception(&local_38);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&sStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  pvVar7 = (this->data->
           super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
LAB_001f0dd3:
  uVar1 = pvVar7[ind].field_0;
  uVar3 = pvVar7[ind].field_1;
  vVar5.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_unsigned_int,_(glm::qualifier)0>_5)uVar3;
  vVar5.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_unsigned_int,_(glm::qualifier)0>_3)uVar1;
  uVar2 = pvVar7[ind].field_2;
  uVar4 = pvVar7[ind].field_3;
  vVar5.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_unsigned_int,_(glm::qualifier)0>_9)uVar4;
  vVar5.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_unsigned_int,_(glm::qualifier)0>_7)uVar2;
  return vVar5;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}